

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3WhereSplit(WhereClause *pWC,Expr *pExpr,u8 op)

{
  Expr *pEVar1;
  
  while( true ) {
    pEVar1 = sqlite3ExprSkipCollateAndLikely(pExpr);
    pWC->op = op;
    if (pEVar1 == (Expr *)0x0) {
      return;
    }
    if (pEVar1->op != op) break;
    sqlite3WhereSplit(pWC,pEVar1->pLeft,op);
    pExpr = pEVar1->pRight;
  }
  whereClauseInsert(pWC,pExpr,0);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereSplit(WhereClause *pWC, Expr *pExpr, u8 op){
  Expr *pE2 = sqlite3ExprSkipCollateAndLikely(pExpr);
  pWC->op = op;
  assert( pE2!=0 || pExpr==0 );
  if( pE2==0 ) return;
  if( pE2->op!=op ){
    whereClauseInsert(pWC, pExpr, 0);
  }else{
    sqlite3WhereSplit(pWC, pE2->pLeft, op);
    sqlite3WhereSplit(pWC, pE2->pRight, op);
  }
}